

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

cmStateSnapshot * __thiscall
cmListFileBacktrace::GetBottom(cmStateSnapshot *__return_storage_ptr__,cmListFileBacktrace *this)

{
  element_type *peVar1;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar2;
  element_type *peVar3;
  
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,(cmState *)0x0);
  peVar1 = (this->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    do {
      peVar3 = peVar1;
      peVar1 = (peVar3->Parent).
               super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
    } while (peVar1 != (element_type *)0x0);
    (__return_storage_ptr__->Position).Position = (peVar3->field_0).Bottom.Position.Position;
    pcVar2 = (peVar3->field_0).Bottom.Position.Tree;
    __return_storage_ptr__->State = (peVar3->field_0).Bottom.State;
    (__return_storage_ptr__->Position).Tree = pcVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmListFileBacktrace::GetBottom() const
{
  cmStateSnapshot bottom;
  if (Entry const* cur = this->TopEntry.get()) {
    while (Entry const* parent = cur->Parent.get()) {
      cur = parent;
    }
    bottom = cur->Bottom;
  }
  return bottom;
}